

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::TextureViewTestViewSampling::iterate(TextureViewTestViewSampling *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  GLenum texture_target;
  GLenum view_texture_target;
  ContextInfo *pCVar1;
  bool bVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  NotSupportedError *this_02;
  char *description;
  pointer ppVar4;
  qpTestResult local_1cc;
  _compatible_texture_target_pairs texture_target_pairs;
  undefined1 local_1b0 [384];
  
  pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                    ((pCVar1->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar1->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,"GL_ARB_texture_view");
  if (_Var3._M_current !=
      (pCVar1->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    initTest(this);
    initPerSampleFillerProgramObject(this);
    TextureViewUtilities::getLegalTextureAndViewTargetCombinations();
    this_00 = (ostringstream *)(local_1b0 + 8);
    this_01 = (ostringstream *)(local_1b0 + 8);
    local_1cc = QP_TEST_RESULT_PASS;
    for (ppVar4 = texture_target_pairs.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 != texture_target_pairs.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      texture_target = ppVar4->first;
      view_texture_target = ppVar4->second;
      initTextureObject(this,false,texture_target,view_texture_target);
      initTextureObject(this,true,texture_target,view_texture_target);
      initParentTextureContents(this);
      initIterationSpecificProgramObject(this);
      bVar2 = executeTest(this);
      if (bVar2) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::operator<<((ostream *)this_01,"Test case succeeded.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Test case failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        local_1cc = QP_TEST_RESULT_FAIL;
      }
    }
    description = "Pass";
    if (local_1cc != QP_TEST_RESULT_PASS) {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,local_1cc,description)
    ;
    std::
    _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Vector_base(&texture_target_pairs.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   );
    return STOP;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"GL_ARB_texture_view is not supported",
             (allocator<char> *)&texture_target_pairs);
  tcu::NotSupportedError::NotSupportedError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestViewSampling::iterate()
{
	bool has_failed = false;

	/* Make sure GL_ARB_texture_view is reported as supported before carrying on
	 * with actual execution */
	const std::vector<std::string>& extensions = m_context.getContextInfo().getExtensions();

	if (std::find(extensions.begin(), extensions.end(), "GL_ARB_texture_view") == extensions.end())
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported");
	}

	/* Initialize all objects required to run the test */
	initTest();

	/* Initialize per-sample filler program */
	initPerSampleFillerProgramObject();

	/* Iterate through all texture/view texture target combinations */
	TextureViewUtilities::_compatible_texture_target_pairs_const_iterator texture_target_iterator;
	TextureViewUtilities::_compatible_texture_target_pairs				  texture_target_pairs =
		TextureViewUtilities::getLegalTextureAndViewTargetCombinations();

	for (texture_target_iterator = texture_target_pairs.begin(); texture_target_iterator != texture_target_pairs.end();
		 ++texture_target_iterator)
	{
		const glw::GLenum parent_texture_target = texture_target_iterator->first;
		const glw::GLenum view_texture_target   = texture_target_iterator->second;

		/* Initialize parent texture */
		initTextureObject(false /* is_view_texture */, parent_texture_target, view_texture_target);

		/* Initialize view */
		initTextureObject(true /* is_view_texture */, parent_texture_target, view_texture_target);

		/* Initialize contents of the parent texture */
		initParentTextureContents();

		/* Initialize iteration-specific test program object */
		initIterationSpecificProgramObject();

		/* Run the actual test */
		bool status = executeTest();

		if (!status)
		{
			has_failed = true;

			m_testCtx.getLog() << tcu::TestLog::Message << "Test case failed." << tcu::TestLog::EndMessage;
		}
		else
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test case succeeded." << tcu::TestLog::EndMessage;
		}
	}

	if (!has_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}